

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdSignEcdsaAdaptor(void *handle,char *msg,char *sk,char *adaptor,char **adaptor_signature,
                       char **adaptor_proof)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CfdException *pCVar4;
  allocator local_123;
  allocator local_122;
  allocator local_121;
  string local_120;
  AdaptorPair pair;
  Privkey local_d0;
  char *work_signature;
  undefined8 local_a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  string local_70;
  string local_50;
  
  work_signature = (char *)0x0;
  local_a8 = 0;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(msg);
  if (bVar1) {
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xdc;
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pair,"msg is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pair,"Failed to parameter. msg is null or empty.",(allocator *)&local_120)
    ;
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pair);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(sk);
  if (bVar1) {
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xe2;
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pair,"sk is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pair,"Failed to parameter. sk is null or empty.",(allocator *)&local_120);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pair);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(adaptor);
  if (bVar1) {
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xe8;
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pair,"adaptor is null or empty.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pair,"Failed to parameter. adaptor is null or empty.",
               (allocator *)&local_120);
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pair);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (adaptor_signature != (char **)0x0) {
    if (adaptor_proof != (char **)0x0) {
      std::__cxx11::string::string((string *)&local_120,msg,&local_121);
      cfd::core::ByteData256::ByteData256((ByteData256 *)&local_88,&local_120);
      std::__cxx11::string::string((string *)&local_50,sk,&local_122);
      cfd::core::Privkey::Privkey(&local_d0,&local_50,kMainnet,true);
      std::__cxx11::string::string((string *)&local_70,adaptor,&local_123);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_a0,&local_70);
      cfd::core::AdaptorUtil::Sign(&pair,(ByteData256 *)&local_88,&local_d0,(Pubkey *)&local_a0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
      std::__cxx11::string::~string((string *)&local_70);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0);
      std::__cxx11::string::~string((string *)&local_50);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
      std::__cxx11::string::~string((string *)&local_120);
      cfd::core::AdaptorSignature::GetData(&local_d0.data_,&pair.signature);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_120,&local_d0.data_);
      pcVar2 = cfd::capi::CreateString(&local_120);
      work_signature = pcVar2;
      std::__cxx11::string::~string((string *)&local_120);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0);
      cfd::core::AdaptorProof::GetData(&local_d0.data_,&pair.proof);
      cfd::core::ByteData::GetHex_abi_cxx11_(&local_120,&local_d0.data_);
      pcVar3 = cfd::capi::CreateString(&local_120);
      std::__cxx11::string::~string((string *)&local_120);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d0);
      *adaptor_signature = pcVar2;
      *adaptor_proof = pcVar3;
      cfd::core::AdaptorPair::~AdaptorPair(&pair);
      return 0;
    }
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xf4;
    pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
    cfd::core::logger::warn<>((CfdSourceLocation *)&pair,"adaptor proof is null.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&pair,"Failed to parameter. adaptor proof is null.",(allocator *)&local_120
              );
    cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pair);
    __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xee;
  pair.signature.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "CfdSignEcdsaAdaptor";
  cfd::core::logger::warn<>((CfdSourceLocation *)&pair,"adaptor signature is null.");
  pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&pair,"Failed to parameter. adaptor signature is null.",
             (allocator *)&local_120);
  cfd::core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)&pair);
  __cxa_throw(pCVar4,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdSignEcdsaAdaptor(
    void* handle, const char* msg, const char* sk, const char* adaptor,
    char** adaptor_signature, char** adaptor_proof) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_signature = nullptr;
  char* work_proof = nullptr;
  try {
    cfd::Initialize();
    if (IsEmptyString(msg)) {
      warn(CFD_LOG_SOURCE, "msg is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. msg is null or empty.");
    }
    if (IsEmptyString(sk)) {
      warn(CFD_LOG_SOURCE, "sk is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sk is null or empty.");
    }
    if (IsEmptyString(adaptor)) {
      warn(CFD_LOG_SOURCE, "adaptor is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor is null or empty.");
    }
    if (adaptor_signature == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor signature is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor signature is null.");
    }
    if (adaptor_proof == nullptr) {
      warn(CFD_LOG_SOURCE, "adaptor proof is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. adaptor proof is null.");
    }

    AdaptorPair pair =
        AdaptorUtil::Sign(ByteData256(msg), Privkey(sk), Pubkey(adaptor));

    work_signature = CreateString(pair.signature.GetData().GetHex());
    work_proof = CreateString(pair.proof.GetData().GetHex());

    *adaptor_signature = work_signature;
    *adaptor_proof = work_proof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_signature, &work_proof);
  return result;
}